

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

result<long,_toml::error_info> *
toml::read_oct_int<long>
          (result<long,_toml::error_info> *__return_storage_ptr__,string *str,source_location *src)

{
  long val;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  source_location local_2c8;
  error_info local_250;
  istringstream iss;
  uint auStack_1e0 [2];
  byte abStack_1d8 [352];
  error_info local_78;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)str,_S_in);
  *(uint *)((long)auStack_1e0 + *(long *)(_iss + -0x18)) =
       *(uint *)((long)auStack_1e0 + *(long *)(_iss + -0x18)) & 0xffffffb5 | 0x40;
  std::istream::_M_extract<long>((long *)&iss);
  if ((abStack_1d8[*(long *)(_iss + -0x18)] & 5) == 0) {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = 0;
  }
  else {
    CLI::std::__cxx11::to_string(&local_308,0x3f);
    std::operator+(&local_2e8,"toml::parse_oct_integer: too large integer: current max value = 2^",
                   &local_308);
    source_location::source_location(&local_2c8,src);
    CLI::std::__cxx11::to_string(&local_348,0x3f);
    std::operator+(&local_328,"must be < 2^",&local_348);
    make_error_info<>(&local_250,(string *)&local_2e8,&local_2c8,(string *)&local_328);
    err<toml::error_info>((failure<toml::error_info> *)&local_78,&local_250);
    result<long,_toml::error_info>::result(__return_storage_ptr__,(failure_type *)&local_78);
    error_info::~error_info(&local_78);
    error_info::~error_info(&local_250);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    source_location::~source_location(&local_2c8);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_308);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return __return_storage_ptr__;
}

Assistant:

result<T, error_info>
read_oct_int(const std::string& str, const source_location src)
{
    constexpr auto max_digits = std::numeric_limits<T>::digits;
    assert( ! str.empty());

    T val{0};
    std::istringstream iss(str);
    iss >> std::oct >> val;
    if(iss.fail())
    {
        return err(make_error_info("toml::parse_oct_integer: "
            "too large integer: current max value = 2^" + std::to_string(max_digits),
            std::move(src), "must be < 2^" + std::to_string(max_digits)));
    }
    return ok(val);
}